

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_ec_asn1.cc
# Opt level: O0

int ec_copy_parameters(EVP_PKEY *to,EVP_PKEY *from)

{
  EC_GROUP *group_00;
  EC_KEY *pEVar1;
  EC_GROUP *group;
  EC_KEY *from_key;
  EVP_PKEY *from_local;
  EVP_PKEY *to_local;
  
  if ((EC_KEY *)from->pkey == (EC_KEY *)0x0) {
    ERR_put_error(6,0,0x78,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/p_ec_asn1.cc"
                  ,0xb3);
    to_local._4_4_ = 0;
  }
  else {
    group_00 = EC_KEY_get0_group((EC_KEY *)from->pkey);
    if (group_00 == (EC_GROUP *)0x0) {
      ERR_put_error(6,0,0x76,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/p_ec_asn1.cc"
                    ,0xb8);
      to_local._4_4_ = 0;
    }
    else {
      if (to->pkey == (void *)0x0) {
        pEVar1 = EC_KEY_new();
        to->pkey = pEVar1;
        if (to->pkey == (void *)0x0) {
          return 0;
        }
      }
      to_local._4_4_ = EC_KEY_set_group((EC_KEY *)to->pkey,group_00);
    }
  }
  return to_local._4_4_;
}

Assistant:

static int ec_copy_parameters(EVP_PKEY *to, const EVP_PKEY *from) {
  const EC_KEY *from_key = reinterpret_cast<const EC_KEY *>(from->pkey);
  if (from_key == NULL) {
    OPENSSL_PUT_ERROR(EVP, EVP_R_NO_KEY_SET);
    return 0;
  }
  const EC_GROUP *group = EC_KEY_get0_group(from_key);
  if (group == NULL) {
    OPENSSL_PUT_ERROR(EVP, EVP_R_MISSING_PARAMETERS);
    return 0;
  }
  if (to->pkey == NULL) {
    to->pkey = EC_KEY_new();
    if (to->pkey == NULL) {
      return 0;
    }
  }
  return EC_KEY_set_group(reinterpret_cast<EC_KEY *>(to->pkey), group);
}